

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O0

int GetNormal(Edge *e,double *v1,double *v2)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double dVar1;
  double length;
  uint local_4;
  
  *(double *)(in_RDI + 0x30) = in_RDX[1] - in_RSI[1];
  *(double *)(in_RDI + 0x38) = -(*in_RDX - *in_RSI);
  dVar1 = sqrt(*(double *)(in_RDI + 0x30) * *(double *)(in_RDI + 0x30) +
               *(double *)(in_RDI + 0x38) * *(double *)(in_RDI + 0x38));
  if (1.0 <= dVar1) {
    *(double *)(in_RDI + 0x30) = *(double *)(in_RDI + 0x30) / dVar1;
    *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) / dVar1;
    *(double *)(in_RDI + 0x40) =
         -(*in_RSI * *(double *)(in_RDI + 0x30) + in_RSI[1] * *(double *)(in_RDI + 0x38));
  }
  local_4 = (uint)(1.0 > dVar1);
  return local_4;
}

Assistant:

int GetNormal(struct Edge *e, double *v1, double *v2)
{
   /* get line normal */
   double length;

   e->a = v2[1] - v1[1];
   e->b = -(v2[0] - v1[0]);

   /* make line normal unit length */
   length = sqrt(e->a * e->a + e->b * e->b);
   if (length < 1.0f)
      return true;
   e->a /= length;
   e->b /= length;

   /* calculate distance of line from origin */
   e->c = -(v1[0] * e->a + v1[1] * e->b);
   return false;
}